

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeoutMonitor.cpp
# Opt level: O2

void __thiscall helics::TimeoutMonitor::reset(TimeoutMonitor *this)

{
  pointer plVar1;
  linkConnection *conn;
  pointer plVar2;
  
  (this->parentConnection).waitingForPingReply = false;
  this->waitingForConnection = false;
  plVar1 = (this->connections).
           super__Vector_base<helics::linkConnection,_std::allocator<helics::linkConnection>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (plVar2 = (this->connections).
                super__Vector_base<helics::linkConnection,_std::allocator<helics::linkConnection>_>.
                _M_impl.super__Vector_impl_data._M_start; plVar2 != plVar1; plVar2 = plVar2 + 1) {
    plVar2->waitingForPingReply = false;
  }
  return;
}

Assistant:

void TimeoutMonitor::reset()
{
    parentConnection.waitingForPingReply = false;
    waitingForConnection = false;
    for (auto& conn : connections) {
        conn.waitingForPingReply = false;
    }
}